

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

ArenaDtorNeeds __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsArenaDestructor(MessageGenerator *this)

{
  bool bVar1;
  ArenaDtorNeeds AVar2;
  value_type field;
  FieldGenerator *pFVar3;
  Options *in_RCX;
  ArenaDtorNeeds AVar4;
  Iterator __begin3;
  Iterator __end3;
  string local_58;
  Iterator local_38;
  
  SimpleBaseClass_abi_cxx11_
            (&local_58,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  AVar4 = kNone;
  if (local_58._M_string_length == 0) {
    local_58._M_string_length = (size_type)this->descriptor_;
    local_58._M_dataplus._M_p._0_4_ = 0;
    local_38.idx = ((Descriptor *)local_58._M_string_length)->field_count_;
    local_38.descriptor = (Descriptor *)local_58._M_string_length;
    bVar1 = protobuf::internal::operator==((Iterator *)&local_58,&local_38);
    AVar4 = kNone;
    if (!bVar1) {
      AVar4 = kNone;
      do {
        field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*((Iterator *)&local_58);
        pFVar3 = FieldGeneratorTable::get(&this->field_generators_,field);
        AVar2 = (**(code **)((long)((pFVar3->impl_)._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl)->_vptr_FieldGeneratorBase + 0xe8))();
        if ((int)AVar2 < (int)AVar4) {
          AVar2 = AVar4;
        }
        AVar4 = AVar2;
        local_58._M_dataplus._M_p._0_4_ = (int)local_58._M_dataplus._M_p + 1;
        bVar1 = protobuf::internal::operator==((Iterator *)&local_58,&local_38);
      } while (!bVar1);
    }
  }
  return AVar4;
}

Assistant:

ArenaDtorNeeds MessageGenerator::NeedsArenaDestructor() const {
  if (HasSimpleBaseClass(descriptor_, options_)) return ArenaDtorNeeds::kNone;
  ArenaDtorNeeds needs = ArenaDtorNeeds::kNone;
  for (const auto* field : FieldRange(descriptor_)) {
    needs =
        std::max(needs, field_generators_.get(field).NeedsArenaDestructor());
  }
  return needs;
}